

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2_core.c
# Opt level: O0

int rxa2_argon_initialize(argon2_instance_t *instance,argon2_context *context)

{
  long in_RSI;
  long in_RDI;
  int result;
  uint8_t blockhash [72];
  argon2_type in_stack_00000084;
  argon2_context *in_stack_00000088;
  uint8_t *in_stack_00000090;
  argon2_instance_t *in_stack_00000388;
  uint8_t *in_stack_00000390;
  undefined1 local_68 [64];
  undefined1 auStack_28 [36];
  int local_4;
  
  if ((in_RDI == 0) || (in_RSI == 0)) {
    local_4 = -0x19;
  }
  else {
    *(long *)(in_RDI + 0x30) = in_RSI;
    rxa2_initial_hash(in_stack_00000090,in_stack_00000088,in_stack_00000084);
    rxa2_clear_internal_memory(auStack_28,8);
    rxa2_fill_first_blocks(in_stack_00000390,in_stack_00000388);
    rxa2_clear_internal_memory(local_68,0x48);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int rxa2_argon_initialize(argon2_instance_t *instance, argon2_context *context) {
	uint8_t blockhash[ARGON2_PREHASH_SEED_LENGTH];
	int result = ARGON2_OK;

	if (instance == NULL || context == NULL)
		return ARGON2_INCORRECT_PARAMETER;
	instance->context_ptr = context;

	/* 1. Memory allocation */
	/*result = allocate_memory(context, (uint8_t **)&(instance->memory), instance->memory_blocks, sizeof(block));
	if (result != ARGON2_OK) {
		return result;
	}*/

	/* 2. Initial hashing */
	/* H_0 + 8 extra bytes to produce the first blocks */
	/* uint8_t blockhash[ARGON2_PREHASH_SEED_LENGTH]; */
	/* Hashing all inputs */
	rxa2_initial_hash(blockhash, context, instance->type);
	/* Zeroing 8 extra bytes */
	rxa2_clear_internal_memory(blockhash + ARGON2_PREHASH_DIGEST_LENGTH,
		ARGON2_PREHASH_SEED_LENGTH -
		ARGON2_PREHASH_DIGEST_LENGTH);

	/* 3. Creating first blocks, we always have at least two blocks in a slice
	 */
	rxa2_fill_first_blocks(blockhash, instance);
	/* Clearing the hash */
	rxa2_clear_internal_memory(blockhash, ARGON2_PREHASH_SEED_LENGTH);

	return ARGON2_OK;
}